

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O1

Str32 tl::toUtf32(CStr o)

{
  uint uVar1;
  char32_t *pcVar2;
  u32 size;
  char32_t cVar3;
  undefined8 in_RDX;
  char *extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  undefined8 extraout_RDX_02;
  ulong uVar5;
  StrT<char32_t> *this;
  bool bVar6;
  Str32 SVar7;
  CStr o_00;
  char *c;
  char *local_38;
  
  this = o._0_8_;
  StrT<char32_t>::StrT(this);
  o_00._str = extraout_RDX;
  o_00._0_8_ = in_RDX;
  size = calcSizeUtf32((tl *)((ulong)o._str & 0xffffffff),o_00);
  uVar4 = extraout_RDX_00;
  if (1 < size + 1) {
    StrT<char32_t>::resizeNoCopy(this,size);
    cVar3 = getUtf32TokenAndAdvance(&local_38);
    uVar4 = CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),cVar3 == L'\xffffffff' || size == 0);
    if (cVar3 != L'\xffffffff' && size != 0) {
      uVar1 = this->_size;
      pcVar2 = this->_str;
      uVar5 = 1;
      do {
        if (uVar5 - uVar1 == 1) {
          __assert_fail("i < _size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/str.hpp"
                        ,0x52,"CharT &tl::StrT<char32_t>::operator[](u32) [CharT = char32_t]");
        }
        pcVar2[uVar5 - 1] = cVar3;
        cVar3 = getUtf32TokenAndAdvance(&local_38);
        uVar4 = extraout_RDX_02;
      } while ((cVar3 != L'\xffffffff') && (bVar6 = uVar5 < size, uVar5 = uVar5 + 1, bVar6));
    }
  }
  SVar7._8_8_ = uVar4;
  SVar7._str = (char32_t *)this;
  return SVar7;
}

Assistant:

Str32 toUtf32(CStr o)
{
    Str32 res;
    const u32 size = calcSizeUtf32(o);
    if(size == 0 || size == TOKEN_ERROR)
        return res;
    res.resizeNoCopy(size);
    const char* c = o.c_str();
    char32_t token = getUtf32TokenAndAdvance(c);
    for(u32 i = 0; i < size && token != TOKEN_ERROR; i++) {
        res[i] = token;
        token = getUtf32TokenAndAdvance(c);
    }
    return res;
}